

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

wchar_t borg_slot(wchar_t tval,wchar_t sval)

{
  uint8_t *puVar1;
  wchar_t wVar2;
  ulong uVar3;
  
  if ((ulong)z_info->pack_size != 0) {
    puVar1 = &borg_items->iqty;
    wVar2 = L'\xffffffff';
    uVar3 = 0;
    do {
      if ((((*puVar1 != 0) && (*(uint32_t *)(puVar1 + -0xc) != 0)) && ((uint)puVar1[-4] == tval)) &&
         (((uint)puVar1[-3] == sval &&
          ((wVar2 < L'\0' || (*puVar1 <= borg_items[(uint)wVar2].iqty)))))) {
        wVar2 = (wchar_t)uVar3;
      }
      uVar3 = uVar3 + 1;
      puVar1 = puVar1 + 0x388;
    } while (z_info->pack_size != uVar3);
    return wVar2;
  }
  return L'\xffffffff';
}

Assistant:

int borg_slot(int tval, int sval)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip un-aware items */
        if (!item->kind)
            continue;

        /* Require correct tval */
        if (item->tval != tval)
            continue;

        /* Require correct sval */
        if (item->sval != sval)
            continue;

        /* Prefer smallest pile */
        if ((n >= 0) && (item->iqty > borg_items[n].iqty))
            continue;

        /* Prefer largest "pval" (even if smaller pile)*/
        if ((n >= 0) && (item->pval < borg_items[n].pval)
            && (item->iqty > borg_items[n].iqty))
            continue;

        /* Save this item */
        n = i;
    }

    /* Done */
    return (n);
}